

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineTemplate.h
# Opt level: O3

void __thiscall
kiste::LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::text_segment
          (LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this,string *line)

{
  std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,"\"",1);
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (this->_serialize,line);
  std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,"\"",1);
  return;
}

Assistant:

void text_segment(const std::string& line)
    {
    _serialize.text("\"");_serialize.escape(line);_serialize.text("\"");
    }